

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O3

void anon_unknown.dwarf_37ce6b::addLine
               (VertexArray *vertices,float lineLength,float lineTop,Color *color,float offset,
               float thickness,float outlineThickness)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint in_XMM4_Db;
  uint in_XMM4_Dc;
  uint in_XMM4_Dd;
  Vector2f local_70;
  Vector2f local_64;
  Vertex local_5c;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  float local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  
  local_48 = outlineThickness;
  uStack_44 = in_XMM4_Db;
  uStack_40 = in_XMM4_Dc;
  uStack_3c = in_XMM4_Dd;
  fVar1 = floorf(((lineTop + offset) - thickness * 0.5) + 0.5);
  fVar2 = floorf(thickness + 0.5);
  local_64.x = -local_48;
  uStack_34 = uStack_44 ^ 0x80000000;
  uStack_30 = uStack_40 ^ 0x80000000;
  uStack_2c = uStack_3c ^ 0x80000000;
  fVar4 = fVar1 - local_48;
  local_70.x = 1.0;
  local_70.y = 1.0;
  local_64.y = fVar4;
  local_38 = local_64.x;
  sf::Vertex::Vertex(&local_5c,&local_64,color,&local_70);
  sf::VertexArray::append(vertices,&local_5c);
  fVar3 = lineLength + local_48;
  local_70.x = 1.0;
  local_70.y = 1.0;
  local_64.x = fVar3;
  local_64.y = fVar4;
  sf::Vertex::Vertex(&local_5c,&local_64,color,&local_70);
  sf::VertexArray::append(vertices,&local_5c);
  fVar1 = fVar2 + fVar1 + local_48;
  local_64.x = local_38;
  local_70.x = 1.0;
  local_70.y = 1.0;
  local_64.y = fVar1;
  sf::Vertex::Vertex(&local_5c,&local_64,color,&local_70);
  sf::VertexArray::append(vertices,&local_5c);
  local_64.x = local_38;
  local_70.x = 1.0;
  local_70.y = 1.0;
  local_64.y = fVar1;
  sf::Vertex::Vertex(&local_5c,&local_64,color,&local_70);
  sf::VertexArray::append(vertices,&local_5c);
  local_70.x = 1.0;
  local_70.y = 1.0;
  local_64.x = fVar3;
  local_64.y = fVar4;
  sf::Vertex::Vertex(&local_5c,&local_64,color,&local_70);
  sf::VertexArray::append(vertices,&local_5c);
  local_70.x = 1.0;
  local_70.y = 1.0;
  local_64.x = fVar3;
  local_64.y = fVar1;
  sf::Vertex::Vertex(&local_5c,&local_64,color,&local_70);
  sf::VertexArray::append(vertices,&local_5c);
  return;
}

Assistant:

void addLine(sf::VertexArray& vertices, float lineLength, float lineTop, const sf::Color& color, float offset, float thickness, float outlineThickness = 0)
    {
        float top = std::floor(lineTop + offset - (thickness / 2) + 0.5f);
        float bottom = top + std::floor(thickness + 0.5f);

        vertices.append(sf::Vertex(sf::Vector2f(-outlineThickness,             top    - outlineThickness), color, sf::Vector2f(1, 1)));
        vertices.append(sf::Vertex(sf::Vector2f(lineLength + outlineThickness, top    - outlineThickness), color, sf::Vector2f(1, 1)));
        vertices.append(sf::Vertex(sf::Vector2f(-outlineThickness,             bottom + outlineThickness), color, sf::Vector2f(1, 1)));
        vertices.append(sf::Vertex(sf::Vector2f(-outlineThickness,             bottom + outlineThickness), color, sf::Vector2f(1, 1)));
        vertices.append(sf::Vertex(sf::Vector2f(lineLength + outlineThickness, top    - outlineThickness), color, sf::Vector2f(1, 1)));
        vertices.append(sf::Vertex(sf::Vector2f(lineLength + outlineThickness, bottom + outlineThickness), color, sf::Vector2f(1, 1)));
    }